

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp9d_vdpu383.c
# Opt level: O1

MPP_RET hal_vp9d_vdpu383_start(void *hal,HalTaskInfo *task)

{
  long lVar1;
  MppDev ctx;
  long lVar2;
  MPP_RET MVar3;
  long *plVar4;
  char *fmt;
  MppDevRegWrCfg wr_cfg;
  MppDevRegRdCfg rd_cfg;
  long local_40 [3];
  undefined8 local_28;
  
  lVar1 = *(long *)((long)hal + 0x40);
  if (*(int *)((long)hal + 0x38) == 0) {
    plVar4 = (long *)(lVar1 + 0xf0);
  }
  else {
    plVar4 = (long *)((long)(task->dec).reg_index * 0x40 + lVar1 + 0x30);
  }
  ctx = *(MppDev *)((long)hal + 0x10);
  lVar2 = *plVar4;
  if ((lVar2 == 0) &&
     (_mpp_log_l(2,"hal_vp9d_vdpu383","Assertion %s failed at %s:%d\n",(char *)0x0,"hw_regs",
                 "hal_vp9d_vdpu383_start",0x476), (mpp_debug._3_1_ & 0x10) != 0)) {
    abort();
  }
  local_40[0] = lVar2 + 4;
  local_40[1] = 0x200000005c;
  MVar3 = mpp_dev_ioctl(ctx,4,local_40);
  if (MVar3 == MPP_OK) {
    local_40[0] = lVar2 + 0x60;
    local_40[1] = 0x20000000088;
    MVar3 = mpp_dev_ioctl(ctx,4,local_40);
    if (MVar3 == MPP_OK) {
      local_40[0] = lVar2 + 0xe8;
      local_40[1] = 0x100000000ac;
      MVar3 = mpp_dev_ioctl(ctx,4,local_40);
      if (MVar3 == MPP_OK) {
        local_40[0] = lVar2 + 0x194;
        local_40[1] = 0x2a000000104;
        MVar3 = mpp_dev_ioctl(ctx,4,local_40);
        if (MVar3 == MPP_OK) {
          local_40[2] = lVar2 + 0x20;
          local_28 = 0x3c00000004;
          MVar3 = mpp_dev_ioctl(ctx,5,local_40 + 2);
          if (MVar3 == MPP_OK) {
            vdpu383_set_rcbinfo(ctx,(Vdpu383RcbInfo *)(lVar1 + 0x174));
            MVar3 = mpp_dev_ioctl(ctx,0xf,(void *)0x0);
            if (MVar3 == MPP_OK) {
              return MPP_OK;
            }
            _mpp_log_l(2,"hal_vp9d_vdpu383","send cmd failed %d\n","hal_vp9d_vdpu383_start",
                       (ulong)(uint)MVar3);
            return MVar3;
          }
          fmt = "set register read failed %d\n";
          goto LAB_0020c3e2;
        }
      }
    }
  }
  fmt = "set register write failed %d\n";
LAB_0020c3e2:
  _mpp_log_l(2,"hal_vp9d_vdpu383",fmt,"hal_vp9d_vdpu383_start",(ulong)(uint)MVar3);
  return MVar3;
}

Assistant:

static MPP_RET hal_vp9d_vdpu383_start(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;
    HalVp9dCtx *p_hal = (HalVp9dCtx*)hal;
    Vdpu383Vp9dCtx *hw_ctx = (Vdpu383Vp9dCtx*)p_hal->hw_ctx;
    Vdpu383Vp9dRegSet *hw_regs = (Vdpu383Vp9dRegSet *)hw_ctx->hw_regs;
    MppDev dev = p_hal->dev;

    if (p_hal->fast_mode) {
        RK_S32 index = task->dec.reg_index;

        hw_regs = (Vdpu383Vp9dRegSet *)hw_ctx->g_buf[index].hw_regs;
    }

    mpp_assert(hw_regs);

    do {
        MppDevRegWrCfg wr_cfg;
        MppDevRegRdCfg rd_cfg;

        wr_cfg.reg = &hw_regs->ctrl_regs;
        wr_cfg.size = sizeof(hw_regs->ctrl_regs);
        wr_cfg.offset = OFFSET_CTRL_REGS;
        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &hw_regs->common_addr;
        wr_cfg.size = sizeof(hw_regs->common_addr);
        wr_cfg.offset = OFFSET_COMMON_ADDR_REGS;
        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &hw_regs->vp9d_paras;
        wr_cfg.size = sizeof(hw_regs->vp9d_paras);
        wr_cfg.offset = OFFSET_CODEC_PARAS_REGS;
        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        wr_cfg.reg = &hw_regs->vp9d_addrs;
        wr_cfg.size = sizeof(hw_regs->vp9d_addrs);
        wr_cfg.offset = OFFSET_CODEC_ADDR_REGS;
        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        rd_cfg.reg = &hw_regs->ctrl_regs.reg15;
        rd_cfg.size = sizeof(hw_regs->ctrl_regs.reg15);
        rd_cfg.offset = OFFSET_INTERRUPT_REGS;
        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_RD, &rd_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        // rcb info for sram
        vdpu383_set_rcbinfo(dev, hw_ctx->rcb_info);

        ret = mpp_dev_ioctl(dev, MPP_DEV_CMD_SEND, NULL);
        if (ret) {
            mpp_err_f("send cmd failed %d\n", ret);
            break;
        }
    } while (0);

    return ret;
}